

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O2

optional<pbrt::ShapeSample> * __thiscall
pbrt::BilinearPatch::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,BilinearPatch *this,
          ShapeSampleContext *ctx,Point2f u)

{
  ShapeSampleContext *n;
  undefined4 uVar1;
  undefined8 uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  optional<pbrt::ShapeSample> *this_00;
  bool bVar6;
  long lVar7;
  Point3<float> *pPVar8;
  ShapeSample *pSVar9;
  undefined4 extraout_var;
  Point3<float> *this_01;
  Point3<float> *pPVar10;
  Point3<float> *this_02;
  undefined1 in_ZmmResult [64];
  undefined1 auVar17 [48];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 auVar15 [64];
  Float FVar18;
  type tVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 extraout_var_05 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 extraout_var_04 [60];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar70 [56];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar71 [16];
  undefined1 auVar74 [60];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  Point3f PVar80;
  Vector3<float> VVar81;
  Point3f PVar82;
  Vector3<float> VVar83;
  initializer_list<float> v;
  span<const_float> w_00;
  span<const_float> w_01;
  Tuple3<pbrt::Point3,_float> local_1f8;
  undefined4 local_1ec;
  undefined1 local_1e8 [16];
  Point2f u_local;
  Tuple3<pbrt::Point3,_float> local_1b8;
  Tuple3<pbrt::Vector3,_float> local_1a8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  optional<pbrt::ShapeSample> *local_170;
  Float quadPDF;
  float local_160;
  undefined1 local_158 [16];
  Tuple3<pbrt::Vector3,_float> local_148;
  Tuple3<pbrt::Vector3,_float> local_138;
  Tuple3<pbrt::Vector3,_float> local_128;
  Tuple3<pbrt::Vector3,_float> local_118;
  array<float,_4> w;
  Tuple3<pbrt::Vector3,_float> local_90;
  Tuple3<pbrt::Vector3,_float> local_80;
  Tuple3<pbrt::Vector3,_float> local_70;
  Tuple3<pbrt::Vector3,_float> local_60;
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  undefined1 auVar12 [64];
  undefined1 auVar14 [64];
  undefined1 auVar16 [64];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 auVar69 [56];
  undefined1 extraout_var_06 [56];
  
  local_158._8_8_ = local_158._0_8_;
  local_188._8_8_ = local_188._0_8_;
  auVar17 = in_ZmmResult._16_48_;
  auVar24._8_56_ = in_register_00001208;
  auVar24._0_8_ = u.super_Tuple2<pbrt::Point2,_float>;
  u_local.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar24._0_16_);
  local_1e8._8_8_ = local_1e8._0_8_;
  local_1e8._0_8_ = this;
  lVar3 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar4 = *(long *)(lVar3 + 0x10);
  lVar7 = (long)this->blpIndex * 0x10;
  lVar5 = *(long *)(lVar3 + 0x18);
  pPVar8 = (Point3<float> *)((long)*(int *)(lVar4 + 0xc + lVar7) * 0xc + lVar5);
  this_01 = (Point3<float> *)((long)*(int *)(lVar4 + lVar7) * 0xc + lVar5);
  pPVar10 = (Point3<float> *)((long)*(int *)(lVar4 + 4 + lVar7) * 0xc + lVar5);
  this_02 = (Point3<float> *)((long)*(int *)(lVar4 + 8 + lVar7) * 0xc + lVar5);
  local_170 = __return_storage_ptr__;
  PVar80 = ShapeSampleContext::p(ctx);
  local_1f8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
  auVar25._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar25._8_56_ = in_register_00001208;
  local_1f8._0_8_ = vmovlps_avx(auVar25._0_16_);
  VVar81 = Point3<float>::operator-(this_01,(Point3<float> *)&local_1f8);
  w.values[2] = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar26._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar26._0_16_);
  VVar81 = Normalize<float>((Vector3<float> *)&w);
  local_118.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar27._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar27._8_56_ = in_register_00001208;
  local_118._0_8_ = vmovlps_avx(auVar27._0_16_);
  PVar80 = ShapeSampleContext::p(ctx);
  local_1f8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
  auVar28._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar28._8_56_ = in_register_00001208;
  local_1f8._0_8_ = vmovlps_avx(auVar28._0_16_);
  local_188._0_8_ = pPVar10;
  VVar81 = Point3<float>::operator-(pPVar10,(Point3<float> *)&local_1f8);
  w.values[2] = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar29._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar29._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar29._0_16_);
  VVar81 = Normalize<float>((Vector3<float> *)&w);
  local_128.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar30._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar30._8_56_ = in_register_00001208;
  local_128._0_8_ = vmovlps_avx(auVar30._0_16_);
  PVar80 = ShapeSampleContext::p(ctx);
  local_1f8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
  auVar31._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar31._8_56_ = in_register_00001208;
  local_1f8._0_8_ = vmovlps_avx(auVar31._0_16_);
  local_158._0_8_ = this_02;
  VVar81 = Point3<float>::operator-(this_02,(Point3<float> *)&local_1f8);
  w.values[2] = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar32._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar32._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar32._0_16_);
  VVar81 = Normalize<float>((Vector3<float> *)&w);
  local_138.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar33._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar33._8_56_ = in_register_00001208;
  local_138._0_8_ = vmovlps_avx(auVar33._0_16_);
  PVar80 = ShapeSampleContext::p(ctx);
  local_1f8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
  auVar34._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar34._8_56_ = in_register_00001208;
  local_1f8._0_8_ = vmovlps_avx(auVar34._0_16_);
  uVar2 = local_1e8._0_8_;
  VVar81 = Point3<float>::operator-(pPVar8,(Point3<float> *)&local_1f8);
  w.values[2] = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar35._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar35._8_56_ = in_register_00001208;
  w.values._0_8_ = vmovlps_avx(auVar35._0_16_);
  VVar81 = Normalize<float>((Vector3<float> *)&w);
  local_148.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar36._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar36._8_56_ = in_register_00001208;
  local_148._0_8_ = vmovlps_avx(auVar36._0_16_);
  bVar6 = IsRectangle((BilinearPatch *)uVar2);
  if (((bVar6) && (*(long *)(lVar3 + 0x38) == 0)) &&
     (FVar18 = SphericalQuadArea((Vector3f *)&local_118,(Vector3f *)&local_128,
                                 (Vector3f *)&local_148,(Vector3f *)&local_138), 0.0001 < FVar18)) {
    auVar74 = (undefined1  [60])0x0;
    auVar69 = ZEXT456(0);
    local_1e8._0_8_ = lVar3;
    if (*(float *)(ctx + 0x24) == 0.0) {
      auVar74 = (undefined1  [60])0x0;
      if ((*(float *)(ctx + 0x28) == 0.0) && (!NAN(*(float *)(ctx + 0x28)))) {
        auVar69 = (undefined1  [56])0x0;
        auVar74 = ZEXT860(SUB128(ZEXT812(0),4));
        if ((*(float *)(ctx + 0x2c) == 0.0) && (!NAN(*(float *)(ctx + 0x2c)))) {
          auVar37 = ZEXT464(0x3f800000);
          pPVar10 = (Point3<float> *)local_158._0_8_;
          pPVar8 = (Point3<float> *)local_188._0_8_;
          goto LAB_00294222;
        }
      }
    }
    n = ctx + 0x24;
    PVar80 = ShapeSampleContext::p(ctx);
    local_1a8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
    auVar43._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar43._8_56_ = auVar69;
    local_1a8._0_8_ = vmovlps_avx(auVar43._0_16_);
    VVar81 = Point3<float>::operator-(this_01,(Point3<float> *)&local_1a8);
    local_160 = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar44._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar44._8_56_ = auVar69;
    _quadPDF = vmovlps_avx(auVar44._0_16_);
    VVar81 = Normalize<float>((Vector3<float> *)&quadPDF);
    local_1b8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar45._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar45._8_56_ = auVar69;
    local_1b8._0_8_ = vmovlps_avx(auVar45._0_16_);
    auVar46._0_4_ = AbsDot<float>((Vector3<float> *)&local_1b8,(Normal3<float> *)n);
    auVar46._4_60_ = extraout_var_00;
    auVar71 = vmaxss_avx(auVar46._0_16_,ZEXT416(0x3c23d70a));
    auVar69 = ZEXT856(auVar71._8_8_);
    local_1f8.x = auVar71._0_4_;
    VVar81 = Point3<float>::operator-((Point3<float> *)local_188._0_8_,(Point3<float> *)&local_1a8);
    local_50.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar47._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar47._8_56_ = auVar69;
    local_50._0_8_ = vmovlps_avx(auVar47._0_16_);
    VVar81 = Normalize<float>((Vector3<float> *)&local_50);
    local_40.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar48._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar48._8_56_ = auVar69;
    local_40._0_8_ = vmovlps_avx(auVar48._0_16_);
    auVar49._0_4_ = AbsDot<float>((Vector3<float> *)&local_40,(Normal3<float> *)n);
    auVar49._4_60_ = extraout_var_01;
    auVar71 = vmaxss_avx(auVar49._0_16_,ZEXT416(0x3c23d70a));
    auVar69 = ZEXT856(auVar71._8_8_);
    pPVar10 = (Point3<float> *)local_158._0_8_;
    local_1f8.y = auVar71._0_4_;
    VVar81 = Point3<float>::operator-((Point3<float> *)local_158._0_8_,(Point3<float> *)&local_1a8);
    local_70.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar50._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar50._8_56_ = auVar69;
    local_70._0_8_ = vmovlps_avx(auVar50._0_16_);
    VVar81 = Normalize<float>((Vector3<float> *)&local_70);
    local_60.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar51._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar51._8_56_ = auVar69;
    local_60._0_8_ = vmovlps_avx(auVar51._0_16_);
    auVar52._0_4_ = AbsDot<float>((Vector3<float> *)&local_60,(Normal3<float> *)n);
    auVar52._4_60_ = extraout_var_02;
    auVar71 = vmaxss_avx(auVar52._0_16_,ZEXT416(0x3c23d70a));
    auVar69 = ZEXT856(auVar71._8_8_);
    local_1f8.z = auVar71._0_4_;
    VVar81 = Point3<float>::operator-(pPVar8,(Point3<float> *)&local_1a8);
    local_90.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar53._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar53._8_56_ = auVar69;
    local_90._0_8_ = vmovlps_avx(auVar53._0_16_);
    VVar81 = Normalize<float>((Vector3<float> *)&local_90);
    local_80.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar54._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar54._8_56_ = auVar69;
    local_80._0_8_ = vmovlps_avx(auVar54._0_16_);
    auVar55._0_4_ = AbsDot<float>((Vector3<float> *)&local_80,(Normal3<float> *)n);
    auVar55._4_60_ = extraout_var_03;
    auVar71 = vmaxss_avx(auVar55._0_16_,ZEXT416(0x3c23d70a));
    local_1ec = auVar71._0_4_;
    v._M_len = 4;
    v._M_array = &local_1f8.x;
    pstd::array<float,_4>::array(&w,v);
    w_00.n = 4;
    w_00.ptr = w.values;
    auVar56._0_8_ = SampleBilinear(u_local,w_00);
    auVar56._8_56_ = extraout_var_06;
    pPVar8 = (Point3<float> *)local_188._0_8_;
    u_local.super_Tuple2<pbrt::Point2,_float> =
         (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar56._0_16_);
    w_01.n = 4;
    w_01.ptr = w.values;
    auVar37._0_4_ = BilinearPDF(auVar56._0_8_,w_01);
    auVar37._4_60_ = extraout_var_04;
LAB_00294222:
    auVar69 = auVar37._8_56_;
    PVar80 = ShapeSampleContext::p(ctx);
    local_1f8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
    auVar57._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar57._8_56_ = auVar69;
    local_1f8._0_8_ = vmovlps_avx(auVar57._0_16_);
    VVar81 = Point3<float>::operator-(pPVar8,this_01);
    local_1a8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar58._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar58._8_56_ = auVar69;
    local_1a8._0_8_ = vmovlps_avx(auVar58._0_16_);
    VVar81 = Point3<float>::operator-(pPVar10,this_01);
    local_1b8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar59._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar59._8_56_ = auVar69;
    local_1b8._0_8_ = vmovlps_avx(auVar59._0_16_);
    PVar80 = SampleSphericalRectangle
                       ((Point3f *)&local_1f8,this_01,(Vector3f *)&local_1a8,(Vector3f *)&local_1b8,
                        &u_local,&quadPDF);
    w.values[2] = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
    auVar60._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar60._8_56_ = auVar69;
    w.values._0_8_ = vmovlps_avx(auVar60._0_16_);
    fVar20 = auVar37._0_4_ * quadPDF;
    auVar69 = (undefined1  [56])0x0;
    VVar81 = Point3<float>::operator-(pPVar8,this_01);
    local_1a8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar61._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar61._8_56_ = auVar69;
    local_1a8._0_8_ = vmovlps_avx(auVar61._0_16_);
    VVar81 = Point3<float>::operator-(pPVar10,this_01);
    local_1b8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar62._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar62._8_56_ = auVar69;
    local_1b8._0_8_ = vmovlps_avx(auVar62._0_16_);
    VVar81 = Cross<float>((Vector3<float> *)&local_1a8,(Vector3<float> *)&local_1b8);
    local_1f8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar63._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar63._8_56_ = auVar69;
    local_1f8._0_8_ = vmovlps_avx(auVar63._0_16_);
    VVar81 = Normalize<float>((Vector3<float> *)&local_1f8);
    fVar21 = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar64._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar64._8_56_ = auVar69;
    auVar71 = vmovshdup_avx(auVar64._0_16_);
    bVar6 = *(char *)local_1e8._0_8_ == *(char *)(local_1e8._0_8_ + 1);
    auVar12._8_4_ = auVar69._0_4_ ^ 0x80000000;
    auVar12._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
    auVar12._12_4_ = auVar69._4_4_ ^ 0x80000000;
    auVar14._8_4_ = auVar71._8_4_ ^ 0x80000000;
    auVar14._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
    auVar14._12_4_ = auVar71._12_4_ ^ 0x80000000;
    auVar16._8_4_ = auVar74._4_4_ ^ 0x80000000;
    auVar16._0_8_ = CONCAT44(auVar74._0_4_,fVar21) ^ 0x8000000080000000;
    auVar16._12_4_ = auVar74._8_4_ ^ 0x80000000;
    auVar12._16_48_ = auVar17;
    auVar11._4_60_ = auVar12._4_60_;
    auVar11._0_4_ =
         (uint)bVar6 * (int)VVar81.super_Tuple3<pbrt::Vector3,_float>.x +
         (uint)!bVar6 * (int)-VVar81.super_Tuple3<pbrt::Vector3,_float>.x;
    local_1e8 = auVar11._0_16_;
    auVar14._16_48_ = auVar17;
    auVar13._4_60_ = auVar14._4_60_;
    auVar13._0_4_ = (uint)bVar6 * auVar71._0_4_ + (uint)!bVar6 * (auVar71._0_4_ ^ 0x80000000);
    local_188 = auVar13._0_16_;
    auVar16._16_48_ = auVar17;
    auVar15._4_60_ = auVar16._4_60_;
    auVar15._0_4_ = (uint)bVar6 * (int)fVar21 + (uint)!bVar6 * (int)-fVar21;
    local_158 = auVar15._0_16_;
    VVar81 = Point3<float>::operator-((Point3<float> *)&w,this_01);
    auVar65._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar65._8_56_ = auVar69;
    local_198 = auVar65._0_16_;
    VVar83 = Point3<float>::operator-(pPVar8,this_01);
    auVar72._0_4_ = VVar83.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar72._4_60_ = auVar74;
    auVar66._0_8_ = VVar83.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar66._8_56_ = auVar69;
    auVar76._0_4_ = local_198._0_4_ * VVar83.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar76._4_4_ = local_198._4_4_ * VVar83.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar76._8_4_ = local_198._8_4_ * auVar69._0_4_;
    auVar76._12_4_ = local_198._12_4_ * auVar69._4_4_;
    auVar71 = vmovshdup_avx(auVar76);
    auVar71 = vfmadd231ss_fma(auVar71,local_198,auVar66._0_16_);
    auVar76 = vfmadd231ss_fma(auVar71,auVar72._0_16_,
                              ZEXT416((uint)VVar81.super_Tuple3<pbrt::Vector3,_float>.z));
    fVar21 = DistanceSquared<float>(pPVar8,this_01);
    auVar74 = ZEXT1260(auVar76._4_12_);
    auVar70 = ZEXT856(auVar76._8_8_);
    VVar81 = Point3<float>::operator-((Point3<float> *)&w,this_01);
    auVar67._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar67._8_56_ = auVar70;
    local_198._0_4_ = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar69 = auVar70;
    VVar83 = Point3<float>::operator-(pPVar10,this_01);
    auVar73._0_4_ = VVar83.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar73._4_60_ = auVar74;
    auVar68._0_8_ = VVar83.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar68._8_56_ = auVar69;
    auVar77._0_4_ =
         VVar81.super_Tuple3<pbrt::Vector3,_float>.x * VVar83.super_Tuple3<pbrt::Vector3,_float>.x;
    auVar77._4_4_ =
         VVar81.super_Tuple3<pbrt::Vector3,_float>.y * VVar83.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar77._8_4_ = auVar70._0_4_ * auVar69._0_4_;
    auVar77._12_4_ = auVar70._4_4_ * auVar69._4_4_;
    auVar71 = vmovshdup_avx(auVar77);
    auVar71 = vfmadd231ss_fma(auVar71,auVar67._0_16_,auVar68._0_16_);
    local_198 = vfmadd231ss_fma(auVar71,auVar73._0_16_,ZEXT416((uint)local_198._0_4_));
    fVar22 = DistanceSquared<float>(pPVar10,this_01);
    auVar71._4_4_ = w.values[0];
    auVar71._0_4_ = w.values[0];
    auVar71._8_4_ = w.values[0];
    auVar71._12_4_ = w.values[0];
    auVar78._4_4_ = w.values[1];
    auVar78._0_4_ = w.values[1];
    auVar78._8_4_ = w.values[1];
    auVar78._12_4_ = w.values[1];
    uVar1 = *(undefined4 *)(ctx + 0x30);
    local_170->set = true;
    auVar71 = vmovlhps_avx(auVar71,auVar78);
    auVar79._4_4_ = w.values[2];
    auVar79._0_4_ = w.values[2];
    auVar79._8_4_ = w.values[2];
    auVar79._12_4_ = w.values[2];
    *(undefined1 (*) [16])&local_170->optionalValue = auVar71;
    uVar2 = vmovlps_avx(auVar79);
    *(undefined8 *)((long)&local_170->optionalValue + 0x10) = uVar2;
    *(undefined4 *)((long)&local_170->optionalValue + 0x18) = uVar1;
    *(undefined8 *)((long)&local_170->optionalValue + 0x1c) = 0;
    *(undefined4 *)((long)&local_170->optionalValue + 0x24) = 0;
    *(undefined4 *)((long)&local_170->optionalValue + 0x28) = local_1e8._0_4_;
    *(undefined4 *)((long)&local_170->optionalValue + 0x2c) = local_188._0_4_;
    *(undefined4 *)((long)&local_170->optionalValue + 0x30) = local_158._0_4_;
    *(ulong *)((long)&local_170->optionalValue + 0x34) =
         CONCAT44(extraout_var,auVar76._0_4_ / fVar21) |
         (ulong)(uint)((float)local_198._0_4_ / fVar22) << 0x20;
    *(undefined1 (*) [16])((long)&local_170->optionalValue + 0x40) = ZEXT816(0) << 0x20;
    *(float *)((long)&local_170->optionalValue + 0x50) = fVar20;
    return local_170;
  }
  Sample((optional<pbrt::ShapeSample> *)&w,(BilinearPatch *)uVar2,u_local);
  local_1e8._0_4_ = *(undefined4 *)(ctx + 0x30);
  pSVar9 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
  auVar69 = (undefined1  [56])0x0;
  (pSVar9->intr).time = (Float)local_1e8._0_4_;
  pSVar9 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
  this_00 = local_170;
  PVar80 = Interaction::p(&pSVar9->intr);
  auVar38._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar38._8_56_ = auVar69;
  local_1e8 = auVar38._0_16_;
  PVar82 = ShapeSampleContext::p(ctx);
  auVar39._0_8_ = PVar82.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar39._8_56_ = auVar69;
  auVar76 = vsubps_avx(local_1e8,auVar39._0_16_);
  local_1f8._0_8_ = vmovlps_avx(auVar76);
  local_1f8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z -
                PVar82.super_Tuple3<pbrt::Point3,_float>.z;
  auVar75._0_4_ = auVar76._0_4_ * auVar76._0_4_;
  auVar75._4_4_ = auVar76._4_4_ * auVar76._4_4_;
  auVar75._8_4_ = auVar76._8_4_ * auVar76._8_4_;
  auVar75._12_4_ = auVar76._12_4_ * auVar76._12_4_;
  auVar71 = vmovshdup_avx(auVar75);
  auVar71 = vfmadd231ss_fma(auVar71,auVar76,auVar76);
  auVar69 = ZEXT856(0);
  auVar71 = vfmadd231ss_fma(auVar71,ZEXT416((uint)local_1f8.z),ZEXT416((uint)local_1f8.z));
  if ((auVar71._0_4_ != 0.0) || (NAN(auVar71._0_4_))) {
    VVar81 = Normalize<float>((Vector3<float> *)&local_1f8);
    local_1f8.z = VVar81.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar40._0_8_ = VVar81.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar40._8_56_ = auVar69;
    local_1f8._0_8_ = vmovlps_avx(auVar40._0_16_);
    pSVar9 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    auVar23._0_8_ = local_1f8._0_8_ ^ 0x8000000080000000;
    auVar23._8_4_ = 0x80000000;
    auVar23._12_4_ = 0x80000000;
    local_1a8.z = -local_1f8.z;
    local_1a8._0_8_ = vmovlps_avx(auVar23);
    tVar19 = AbsDot<float>(&(pSVar9->intr).n,(Vector3<float> *)&local_1a8);
    local_1e8._0_4_ = tVar19;
    auVar69 = extraout_var_05;
    PVar80 = ShapeSampleContext::p(ctx);
    local_1b8.z = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
    auVar41._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar41._8_56_ = auVar69;
    local_1b8._0_8_ = vmovlps_avx(auVar41._0_16_);
    pSVar9 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    PVar80 = Interaction::p(&pSVar9->intr);
    local_160 = PVar80.super_Tuple3<pbrt::Point3,_float>.z;
    auVar42._0_8_ = PVar80.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar42._8_56_ = auVar69;
    _quadPDF = vmovlps_avx(auVar42._0_16_);
    fVar20 = DistanceSquared<float>((Point3<float> *)&local_1b8,(Point3<float> *)&quadPDF);
    pSVar9 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    pSVar9->pdf = pSVar9->pdf / ((float)local_1e8._0_4_ / fVar20);
    pSVar9 = pstd::optional<pbrt::ShapeSample>::value((optional<pbrt::ShapeSample> *)&w);
    if (ABS(pSVar9->pdf) != INFINITY) {
      pstd::optional<pbrt::ShapeSample>::optional(this_00,(optional<pbrt::ShapeSample> *)&w);
      goto LAB_00294054;
    }
  }
  *(undefined8 *)((long)&this_00->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x50) = 0;
  *(undefined8 *)&this_00->set = 0;
  (this_00->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&this_00->optionalValue + 8) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&this_00->optionalValue + 0x38) = 0;
LAB_00294054:
  pstd::optional<pbrt::ShapeSample>::~optional((optional<pbrt::ShapeSample> *)&w);
  return this_00;
}

Assistant:

pstd::optional<ShapeSample> BilinearPatch::Sample(const ShapeSampleContext &ctx,
                                                  Point2f u) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    // Find normalized vectors to corners of bilinear patch
    Vector3f v00 = Normalize(p00 - ctx.p()), v10 = Normalize(p10 - ctx.p());
    Vector3f v01 = Normalize(p01 - ctx.p()), v11 = Normalize(p11 - ctx.p());

    if (IsRectangle() && !mesh->imageDistribution &&
        SphericalQuadArea(v00, v10, v11, v01) > MinSphericalSampleArea) {
        // Sample direction to rectanglular bilinear patch
        Float pdf = 1;
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Warp uniform sample _u_ to account for incident $\cos \theta$ factor
            // Compute $\cos \theta$ weights for rectangle seen from _ctx.p()_
            Point3f rp = ctx.p();
            pstd::array<Float, 4> w = pstd::array<Float, 4>{
                std::max<Float>(0.01, AbsDot(Normalize(p00 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p10 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p01 - rp), ctx.ns)),
                std::max<Float>(0.01, AbsDot(Normalize(p11 - rp), ctx.ns))};

            u = SampleBilinear(u, w);
            pdf *= BilinearPDF(u, w);
        }
        // Sample spherical rectangle at reference point $\pt{}$
        Float quadPDF;
        Point3f p =
            SampleSphericalRectangle(ctx.p(), p00, p10 - p00, p01 - p00, u, &quadPDF);
        pdf *= quadPDF;

        // Compute surface normal and $(u,v)$ for sampled point on rectangle
        Normal3f n = Normal3f(Normalize(Cross(p10 - p00, p01 - p00)));
        if (mesh->reverseOrientation ^ mesh->transformSwapsHandedness)
            n *= -1;
        Point2f uv(Dot(p - p00, p10 - p00) / DistanceSquared(p10, p00),
                   Dot(p - p00, p01 - p00) / DistanceSquared(p01, p00));

        return ShapeSample{Interaction(p, n, ctx.time, uv), pdf};

    } else {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }
}